

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorCubes.c
# Opt level: O2

int AllocateCover(int nCubes,int nWordsIn,int nWordsOut)

{
  size_t __size;
  int iVar1;
  int iVar2;
  Cube **ppCVar3;
  Cube *pCVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int local_38;
  
  __size = (long)nCubes * 8;
  ppCVar3 = (Cube **)malloc(__size);
  local_38 = 0;
  if (ppCVar3 != (Cube **)0x0) {
    iVar2 = (nWordsOut + nWordsIn) * 4 + 0x28;
    iVar1 = iVar2 * nCubes;
    lVar7 = 1;
    pCVar4 = (Cube *)calloc(1,(long)iVar1);
    *ppCVar3 = pCVar4;
    local_38 = 0;
    if (pCVar4 != (Cube *)0x0) {
      pCVar4->pCubeDataIn = (drow *)(pCVar4 + 1);
      pCVar4->pCubeDataOut = (drow *)(&pCVar4[1].fMark + (nWordsIn << 2));
      lVar5 = (long)iVar2;
      for (; lVar7 < nCubes; lVar7 = lVar7 + 1) {
        pCVar4 = ppCVar3[lVar7 + -1];
        ppCVar3[lVar7] = (Cube *)(&pCVar4->fMark + lVar5);
        *(byte **)((long)&pCVar4->pCubeDataIn + lVar5) = &pCVar4[1].fMark + lVar5;
        *(byte **)((long)&pCVar4->pCubeDataOut + lVar5) =
             &((Cube *)(&pCVar4->fMark + lVar5))[1].fMark + (nWordsIn << 2);
      }
      iVar2 = 1;
      if (1 < nCubes) {
        iVar2 = nCubes;
      }
      for (uVar6 = 0; iVar2 - 1 != uVar6; uVar6 = uVar6 + 1) {
        ppCVar3[uVar6]->Next = ppCVar3[uVar6 + 1];
      }
      s_CubesFree = *ppCVar3;
      g_CoverInfo.nCubesInUse = 0;
      g_CoverInfo.nCubesFree = nCubes;
      s_pCoverMemory = ppCVar3;
      if (g_CoverInfo.nCubesAlloc != nCubes) {
        __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/exor/exorCubes.c"
                      ,0x8e,"int AllocateCover(int, int, int)");
      }
      local_38 = (int)__size;
      local_38 = iVar1 + local_38;
    }
  }
  return local_38;
}

Assistant:

int AllocateCover( int nCubes, int nWordsIn, int nWordsOut )
// uses the cover parameters nCubes and nWords
// to allocate-and-clean the cover in one large piece
{
    int OneCubeSize;
    int OneInputSetSize;
    Cube ** pp;
    int TotalSize;
    int i, k;

    // determine the size of one cube WITH storage for bits
    OneCubeSize = sizeof(Cube) + (nWordsIn+nWordsOut)*sizeof(unsigned);
    // determine what is the amount of storage for the input part of the cube 
    OneInputSetSize = nWordsIn*sizeof(unsigned);

    // allocate memory for the array of pointers
    pp = (Cube **)ABC_ALLOC( Cube *, nCubes );
    if ( pp == NULL )
        return 0;

    // determine the size of the total cube cover
    TotalSize = nCubes*OneCubeSize;
    // allocate and clear memory for the cover in one large piece
    pp[0] = (Cube *)ABC_ALLOC( char, TotalSize );
    if ( pp[0] == NULL )
        return 0;
    memset( pp[0], 0, (size_t)TotalSize );

    // assign pointers to cubes and bit strings inside this piece
    pp[0]->pCubeDataIn  = (unsigned*)(pp[0] + 1);
    pp[0]->pCubeDataOut = (unsigned*)((char*)pp[0]->pCubeDataIn + OneInputSetSize);
    for ( i = 1; i < nCubes; i++ )
    {
        pp[i] = (Cube *)((char*)pp[i-1] + OneCubeSize);
        pp[i]->pCubeDataIn = (unsigned*)(pp[i] + 1);
        pp[i]->pCubeDataOut = (unsigned*)((char*)pp[i]->pCubeDataIn + OneInputSetSize);
    }

    // connect the cubes into the list using Next pointers
    for ( k = 0; k < nCubes-1; k++ )
        pp[k]->Next = pp[k+1];
    // the last pointer is already set to NULL

    // assign the head of the free list
    s_CubesFree = pp[0];
    // set the counters of the used and free cubes
    g_CoverInfo.nCubesInUse = 0;
    g_CoverInfo.nCubesFree = nCubes;

    // save the pointer to the allocated memory
    s_pCoverMemory = pp;

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );

    return nCubes*sizeof(Cube *) + TotalSize;
}